

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateAccessorDeclarations
          (SingularStringView *this,Printer *p)

{
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  allocator<char> local_151;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [8];
  undefined8 uStack_138;
  Printer *p_local;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  variant<std::__cxx11::string,std::function<bool()>> local_b8 [32];
  char local_98;
  _Alloc_hider local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70;
  undefined1 local_28;
  
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = (long)" \t" + 2;
  p_local = p;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&local_d8.default_generated_instance_,
                     (cpp *)(this->super_FieldGeneratorBase).field_,(FieldDescriptor *)&local_128,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(1),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = (local_d0 - (long)local_d8) / 0xb8;
  vars.ptr_ = (pointer)local_d8.default_value_int64_t_;
  io::Printer::WithVars(&v1,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_d8.default_generated_instance_);
  local_128._M_unused._M_member_pointer = 4;
  local_128._8_8_ = (long)"_internal_set_" + 10;
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&local_d8.default_generated_instance_,
                     (cpp *)(this->super_FieldGeneratorBase).field_,(FieldDescriptor *)&local_128,
                     prefixes,(optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_00.len_ = (local_d0 - (long)local_d8) / 0xb8;
  vars_00.ptr_ = (pointer)local_d8.default_value_int64_t_;
  io::Printer::WithVars(&v2,p,vars_00);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_d8.default_generated_instance_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"donated",&local_151);
  local_d8.default_value_enum_ = (EnumValueDescriptor *)local_c8;
  if (local_150 == local_140) {
    uStack_c0 = uStack_138;
  }
  else {
    local_d8.default_value_int64_t_ = (int64_t)local_150;
  }
  local_d0 = local_148;
  local_148 = 0;
  local_140[0] = 0;
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_150 = local_140;
  local_128._M_unused._M_object = operator_new(0x18);
  *(SingularStringView **)local_128._M_unused._0_8_ = this;
  *(Printer ***)((long)local_128._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_128._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_110 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_b8,(function<bool_()> *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70 = 0;
  if (local_98 == '\x01') {
    std::__cxx11::string::assign((char *)&local_90);
  }
  local_28 = 0;
  io::Printer::Emit(p,&local_d8,1,0x18a,
                    "\n            $DEPRECATED$ ::absl::string_view $name$() const;\n            template <typename Arg_ = ::std::string&&>\n            $DEPRECATED$ void $set_name$(Arg_&& arg);\n\n            private:\n            ::absl::string_view _internal_$name$() const;\n            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(::absl::string_view value);\n            $donated$;\n\n            public:\n          "
                   );
  io::Printer::Sub::~Sub((Sub *)&local_d8.default_generated_instance_);
  std::__cxx11::string::~string((string *)&local_150);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v2);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v1);
  return;
}

Assistant:

void SingularStringView::GenerateAccessorDeclarations(io::Printer* p) const {
  auto v1 = p->WithVars(AnnotatedAccessors(field_, {""}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));

  p->Emit({{"donated",
            [&] {
              if (!is_inlined()) return;
              p->Emit(R"cc(
                PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
              )cc");
            }}},
          R"cc(
            $DEPRECATED$ ::absl::string_view $name$() const;
            template <typename Arg_ = ::std::string&&>
            $DEPRECATED$ void $set_name$(Arg_&& arg);

            private:
            ::absl::string_view _internal_$name$() const;
            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(::absl::string_view value);
            $donated$;

            public:
          )cc");
}